

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# antispoof.c
# Opt level: O0

void seat_antispoof_msg(InteractionReadySeat iseat,char *msg)

{
  _Bool _Var1;
  strbuf *sb_00;
  ptrlen pVar2;
  strbuf *sb;
  char *msg_local;
  InteractionReadySeat iseat_local;
  
  sb_00 = strbuf_new();
  seat_set_trust_status(iseat.seat,true);
  _Var1 = seat_can_set_trust_status(iseat.seat);
  if (_Var1) {
    pVar2 = ptrlen_from_asciz(msg);
    BinarySink_put_datapl(sb_00->binarysink_,pVar2);
  }
  else if (*msg != '\0') {
    BinarySink_put_fmt(sb_00->binarysink_,"-- %s ",msg);
    while (sb_00->len < 0x4e) {
      BinarySink_put_byte(sb_00->binarysink_,'-');
    }
  }
  pVar2 = make_ptrlen("\r\n",2);
  BinarySink_put_datapl(sb_00->binarysink_,pVar2);
  pVar2 = ptrlen_from_strbuf(sb_00);
  seat_banner_pl(iseat,pVar2);
  strbuf_free(sb_00);
  return;
}

Assistant:

void seat_antispoof_msg(InteractionReadySeat iseat, const char *msg)
{
    strbuf *sb = strbuf_new();
    seat_set_trust_status(iseat.seat, true);
    if (seat_can_set_trust_status(iseat.seat)) {
        /*
         * If the seat can directly indicate that this message is
         * generated by the client, then we can just use the message
         * unmodified as an unspoofable header.
         */
        put_dataz(sb, msg);
    } else if (*msg) {
        /*
         * Otherwise, add enough padding around it that the server
         * wouldn't be able to mimic it within our line-length
         * constraint.
         */
        put_fmt(sb, "-- %s ", msg);
        while (sb->len < 78)
            put_byte(sb, '-');
    }
    put_datapl(sb, PTRLEN_LITERAL("\r\n"));
    seat_banner_pl(iseat, ptrlen_from_strbuf(sb));
    strbuf_free(sb);
}